

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_tests.cpp
# Opt level: O3

UniValue * __thiscall
RPCTestingSetup::CallRPC(UniValue *__return_storage_ptr__,RPCTestingSetup *this,string args)

{
  pointer pcVar1;
  bool bVar2;
  ulong *in_RDX;
  char *in_R8;
  long in_FS_OFFSET;
  string_view separators;
  string strMethod;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_240;
  vector<UniValue,_std::allocator<UniValue>_> local_228;
  UniValue local_208;
  undefined1 local_1b0 [88];
  undefined1 local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  VType local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  pointer local_108;
  pointer pUStack_100;
  pointer local_f8;
  pointer pUStack_f0;
  pointer local_e8;
  pointer pUStack_e0;
  undefined4 local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_d0;
  undefined8 local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b0;
  undefined8 local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_90;
  undefined8 local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  any local_70;
  undefined4 local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_1b0._0_8_ = *in_RDX;
  local_1b0._8_8_ = in_RDX[1];
  local_208.typ._0_1_ = 0x20;
  separators._M_str = in_R8;
  separators._M_len = (size_t)&local_208;
  util::Split<std::__cxx11::string>
            (&local_240,(util *)&((_Storage<UniValue,_false> *)local_1b0)->_M_value,
             (Span<const_char> *)0x1,separators);
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  pcVar1 = ((local_240.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,pcVar1,
             pcVar1 + (local_240.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->_M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase(&local_240,
             (iterator)
             local_240.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start);
  local_1b0._8_8_ = (long)&(((_Storage<UniValue,_false> *)local_1b0)->_M_value).val + 0x10;
  local_1b0._0_8_ = local_1b0._0_8_ & 0xffffffff00000000;
  local_1b0[0x18] = 0;
  local_1b0._16_8_ = 0;
  local_1b0._40_8_ = (pointer)0x0;
  local_1b0._48_8_ = (pointer)0x0;
  local_1b0._56_8_ = (pointer)0x0;
  local_1b0._64_8_ = (pointer)0x0;
  local_1b0._72_8_ = (pointer)0x0;
  local_1b0._80_8_ = (pointer)0x0;
  local_158 = 1;
  local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
  local_150._M_string_length = 0;
  local_150.field_2._M_local_buf[0] = '\0';
  local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
  local_128._M_string_length = 0;
  local_128.field_2._M_local_buf[0] = '\0';
  local_130 = 0;
  local_d0 = &local_c0;
  local_108 = (pointer)0x0;
  pUStack_100 = (pointer)0x0;
  local_f8 = (pointer)0x0;
  pUStack_f0 = (pointer)0x0;
  local_e8 = (pointer)0x0;
  pUStack_e0 = (pointer)0x0;
  local_d8 = 0;
  local_c8 = 0;
  local_c0._M_local_buf[0] = '\0';
  local_b0 = &local_a0;
  local_a8 = 0;
  local_a0._M_local_buf[0] = '\0';
  local_90 = &local_80;
  local_88 = 0;
  local_80._M_local_buf[0] = '\0';
  local_70._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  local_70._M_storage._M_ptr = (void *)0x0;
  local_60 = 0;
  local_208._0_8_ =
       &(this->super_TestingSetup).super_ChainTestingSetup.super_BasicTestingSetup.m_node;
  std::any::operator=(&local_70,(NodeContext **)&local_208);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (&local_150,&local_58);
  RPCConvertValues(&local_208,&local_58,&local_240);
  local_130 = local_208.typ;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&local_128,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&local_208 + 8));
  local_228.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = local_f8;
  local_228.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_finish = pUStack_100;
  local_228.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_start = local_108;
  local_f8 = (pointer)local_208.keys.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_108 = (pointer)local_208.keys.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
  pUStack_100 = (pointer)local_208.keys.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
  local_208.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_208.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_208.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_228);
  local_228.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = pUStack_e0;
  local_228.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_finish = local_e8;
  local_228.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_start = pUStack_f0;
  pUStack_e0 = local_208.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
  pUStack_f0 = local_208.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
               super__Vector_impl_data._M_start;
  local_e8 = local_208.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
             super__Vector_impl_data._M_finish;
  local_208.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_208.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_208.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_228);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_208.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_208.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208.val._M_dataplus._M_p != &local_208.val.field_2) {
    operator_delete(local_208.val._M_dataplus._M_p,local_208.val.field_2._M_allocated_capacity + 1);
  }
  bVar2 = RPCIsInWarmup((string *)0x0);
  if (bVar2) {
    SetRPCWarmupFinished();
  }
  CRPCTable::execute(__return_storage_ptr__,&tableRPC,
                     (JSONRPCRequest *)&((_Storage<UniValue,_false> *)local_1b0)->_M_value);
  JSONRPCRequest::~JSONRPCRequest
            ((JSONRPCRequest *)&((_Storage<UniValue,_false> *)local_1b0)->_M_value);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_240);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

UniValue RPCTestingSetup::CallRPC(std::string args)
{
    std::vector<std::string> vArgs{SplitString(args, ' ')};
    std::string strMethod = vArgs[0];
    vArgs.erase(vArgs.begin());
    JSONRPCRequest request;
    request.context = &m_node;
    request.strMethod = strMethod;
    request.params = RPCConvertValues(strMethod, vArgs);
    if (RPCIsInWarmup(nullptr)) SetRPCWarmupFinished();
    try {
        UniValue result = tableRPC.execute(request);
        return result;
    }
    catch (const UniValue& objError) {
        throw std::runtime_error(objError.find_value("message").get_str());
    }
}